

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  void *__s2;
  uint in_ECX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar5;
  int ofs;
  char *pFile_comment;
  mz_uint file_comment_len;
  mz_uint file_extra_len;
  char *pFilename;
  mz_uint filename_len;
  mz_uint8 *pHeader;
  size_t comment_len;
  size_t name_len;
  mz_uint file_index;
  mz_uint i_1;
  mz_uint i;
  int local_c8;
  int local_c0;
  int local_bc;
  int local_b4;
  ulong local_b0;
  int local_a4;
  void *local_90;
  uint local_84;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar6;
  int local_48;
  uint local_44;
  uint local_24;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (in_RSI == (char *)0x0)) ||
     (*(int *)(in_RDI + 0x14) != 1)) {
    local_48 = -1;
  }
  else if ((((in_ECX & 0x300) == 0) && (in_RDX == (char *)0x0)) &&
          (*(long *)(*(long *)(in_RDI + 0x58) + 0x48) != 0)) {
    local_48 = (anonymous_namespace)::miniz::mz_zip_reader_locate_file_binary_search
                         ((mz_zip_archive *)CONCAT44(in_ECX,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff90);
  }
  else {
    sVar3 = strlen(in_RSI);
    if (sVar3 < 0x10000) {
      if (in_RDX == (char *)0x0) {
        local_b0 = 0;
      }
      else {
        local_b0 = strlen(in_RDX);
      }
      if (local_b0 < 0x10000) {
        for (uVar6 = 0; uVar6 < *(uint *)(in_RDI + 0x10); uVar6 = uVar6 + 1) {
          lVar4 = **(long **)(in_RDI + 0x58) +
                  (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x20) + (ulong)uVar6 * 4);
          local_84 = (uint)*(ushort *)(lVar4 + 0x1c);
          local_90 = (void *)(lVar4 + 0x2e);
          if (sVar3 <= local_84) {
            if (local_b0 == 0) {
LAB_001db22e:
              if (((in_ECX & 0x200) != 0) && (local_84 != 0)) {
                local_a4 = local_84 - 1;
                do {
                  if (((*(char *)((long)local_90 + (long)local_a4) == '/') ||
                      (*(char *)((long)local_90 + (long)local_a4) == '\\')) ||
                     (*(char *)((long)local_90 + (long)local_a4) == ':')) break;
                  local_a4 = local_a4 + -1;
                } while (-1 < local_a4);
                local_90 = (void *)((long)local_90 + (long)(local_a4 + 1));
                local_84 = local_84 - (local_a4 + 1);
              }
              if (local_84 == sVar3) {
                if ((in_ECX & 0x100) == 0) {
                  for (local_44 = 0; local_44 < local_84; local_44 = local_44 + 1) {
                    if ((in_RSI[local_44] < 'A') || ('Z' < in_RSI[local_44])) {
                      local_c0 = (int)in_RSI[local_44];
                    }
                    else {
                      local_c0 = in_RSI[local_44] + 0x20;
                    }
                    if ((*(char *)((long)local_90 + (ulong)local_44) < 'A') ||
                       ('Z' < *(char *)((long)local_90 + (ulong)local_44))) {
                      local_c8 = (int)*(char *)((long)local_90 + (ulong)local_44);
                    }
                    else {
                      local_c8 = *(char *)((long)local_90 + (ulong)local_44) + 0x20;
                    }
                    if (local_c0 != local_c8) {
                      bVar5 = false;
                      goto LAB_001db482;
                    }
                  }
                  bVar5 = true;
                }
                else {
                  iVar2 = memcmp(in_RSI,local_90,(ulong)local_84);
                  bVar5 = iVar2 == 0;
                }
LAB_001db482:
                if (bVar5) {
                  return uVar6;
                }
              }
            }
            else {
              uVar1 = (uint)*(ushort *)(lVar4 + 0x20);
              __s2 = (void *)((long)local_90 + (ulong)*(ushort *)(lVar4 + 0x1e) + (ulong)local_84);
              if (uVar1 == local_b0) {
                if ((in_ECX & 0x100) == 0) {
                  for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
                    if ((in_RDX[local_24] < 'A') || ('Z' < in_RDX[local_24])) {
                      local_b4 = (int)in_RDX[local_24];
                    }
                    else {
                      local_b4 = in_RDX[local_24] + 0x20;
                    }
                    if ((*(char *)((long)__s2 + (ulong)local_24) < 'A') ||
                       ('Z' < *(char *)((long)__s2 + (ulong)local_24))) {
                      local_bc = (int)*(char *)((long)__s2 + (ulong)local_24);
                    }
                    else {
                      local_bc = *(char *)((long)__s2 + (ulong)local_24) + 0x20;
                    }
                    if (local_b4 != local_bc) {
                      bVar5 = false;
                      goto LAB_001db21d;
                    }
                  }
                  bVar5 = true;
                }
                else {
                  iVar2 = memcmp(in_RDX,__s2,(ulong)uVar1);
                  bVar5 = iVar2 == 0;
                }
LAB_001db21d:
                if (bVar5) goto LAB_001db22e;
              }
            }
          }
        }
        local_48 = -1;
      }
      else {
        local_48 = -1;
      }
    }
    else {
      local_48 = -1;
    }
  }
  return local_48;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName,
                              const char *pComment, mz_uint flags) {
  mz_uint file_index;
  size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) &&
      (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName);
  if (name_len > 0xFFFF)
    return -1;
  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > 0xFFFF)
    return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8 *pHeader =
        &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename =
        (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS),
              file_comment_len =
                  MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) ||
          (!mz_zip_reader_string_equal(pComment, pFile_comment,
                                       file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') ||
            (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) &&
        (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}